

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

int Cec2_ManPerformSweeping(Gia_Man_t *p,Cec2_Par_t *pPars,Gia_Man_t **ppNew)

{
  uint uVar1;
  Gia_Rpr_t GVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  Cec2_Man_t *pMan;
  long lVar11;
  Vec_Int_t *pVVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  size_t sVar15;
  char *pcVar16;
  Abc_Cex_t *pAVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  Gia_Obj_t *pGVar21;
  uint uVar22;
  long lVar23;
  
  pMan = Cec2_ManCreate(p,pPars);
  Gia_ManRandomW(1);
  Gia_ManSetPhase(p);
  if (pPars->fIsMiter != 0) {
    lVar11 = (long)p->vCos->nSize;
    if (0 < lVar11) {
      lVar23 = 0;
      do {
        iVar9 = p->vCos->pArray[lVar23];
        if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_00649246;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (*(long *)(p->pObjs + iVar9) < 0) {
          pAVar17 = Abc_CexAlloc(0,p->vCis->nSize,1);
          pAVar17->iPo = (int)lVar23;
          p->pCexSeq = pAVar17;
          goto LAB_00649203;
        }
        lVar23 = lVar23 + 1;
      } while (lVar11 != lVar23);
    }
  }
  Cec2_ManSimAlloc(p,pPars->nSimWords);
  Cec2_ManSimulateCis(p);
  Cec2_ManSimulate(p,(Vec_Int_t *)0x0,pMan);
  if ((pPars->fIsMiter == 0) || (iVar9 = Cec2_ManSimulateCos(p), iVar9 != 0)) {
    Cec2_ManCreateClasses(p,pMan);
    Cec2_ManPrintStats(p,pPars,pMan);
    if (0 < pPars->nSimRounds) {
      iVar9 = 0;
      do {
        Cec2_ManSimulateCis(p);
        Cec2_ManSimulate(p,(Vec_Int_t *)0x0,pMan);
        if ((pPars->fIsMiter != 0) && (iVar10 = Cec2_ManSimulateCos(p), iVar10 == 0))
        goto LAB_00649203;
        Cec2_ManPrintStats(p,pPars,pMan);
        iVar9 = iVar9 + 1;
      } while (iVar9 < pPars->nSimRounds);
    }
    iVar9 = 0;
    do {
      if (pPars->nItersMax <= iVar9) break;
      pMan->nPatterns = 0;
      Cec2_ManSimulateCis(p);
      pMan->vCexTriples->nSize = 0;
      if (p->nObjs < 1) {
        bVar8 = true;
      }
      else {
        lVar11 = 0;
        lVar23 = 8;
        bVar8 = false;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar4 = *(ulong *)((long)pGVar3 + lVar23 + -8);
          if (((((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) &&
               (*(int *)(&pGVar3->field_0x0 + lVar23) == -1)) &&
              (((uint)p->pReprs[lVar11] >> 0x1d & 1) == 0)) &&
             (iVar10 = (int)(uVar4 & 0x1fffffff),
             *(int *)((long)pGVar3 + lVar23 + (ulong)(uint)(iVar10 * 4) * -3) != -1)) {
            uVar22 = (uint)(uVar4 >> 0x20);
            uVar19 = uVar22 & 0x1fffffff;
            if (*(int *)((long)pGVar3 + lVar23 + (ulong)(uVar19 * 4) * -3) != -1) {
              if (((uint)p->pReprs[lVar11] >> 0x1c & 1) != 0) {
                __assert_fail("!Gia_ObjProved(p, i) && !Gia_ObjFailed(p, i)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                              ,0x3c7,
                              "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)"
                             );
              }
              uVar1 = *(uint *)((long)pGVar3 + lVar23 + (ulong)(uint)(iVar10 << 2) * -3);
              if (((int)uVar1 < 0) ||
                 (uVar19 = *(uint *)((long)pGVar3 + lVar23 + (ulong)(uVar19 << 2) * -3),
                 (int)uVar19 < 0)) goto LAB_00649265;
              uVar19 = Gia_ManHashAnd(pMan->pNew,uVar1 ^ (uint)(uVar4 >> 0x1d) & 1,
                                      uVar19 ^ uVar22 >> 0x1d & 1);
              *(uint *)(&pGVar3->field_0x0 + lVar23) = uVar19;
              if ((int)uVar19 < 0) {
LAB_00649284:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              pGVar14 = pMan->pNew;
              uVar19 = uVar19 >> 1;
              if ((pGVar14->vCopies2).nSize == uVar19) {
                if (pGVar14->nObjs <= (int)uVar19) goto LAB_00649246;
                pGVar21 = pGVar14->pObjs + uVar19;
                uVar19 = Gia_ObjIsMuxType(pGVar21);
                *(ulong *)pGVar21 =
                     *(ulong *)pGVar21 & 0xffffffffbfffffff | (ulong)((uVar19 & 1) << 0x1e);
                Gia_ObjSetPhase(pMan->pNew,pGVar21);
                Vec_IntPush(&pMan->pNew->vCopies2,-1);
              }
              if ((pMan->pNew->vCopies2).nSize != pMan->pNew->nObjs) {
                __assert_fail("Vec_IntSize(&pMan->pNew->vCopies2) == Gia_ManObjNum(pMan->pNew)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                              ,0x3d1,
                              "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)"
                             );
              }
              GVar2 = p->pReprs[lVar11];
              uVar19 = (uint)GVar2 & 0xfffffff;
              if (uVar19 == 0xfffffff) {
                pGVar21 = (Gia_Obj_t *)0x0;
              }
              else {
                if (p->nObjs <= (int)uVar19) goto LAB_00649246;
                pGVar21 = (Gia_Obj_t *)(&p->pObjs->field_0x0 + uVar19 * 0xc);
              }
              if ((pGVar21 != (Gia_Obj_t *)0x0) && (uVar19 = pGVar21->Value, uVar19 != 0xffffffff))
              {
                if (((int)*(uint *)(&pGVar3->field_0x0 + lVar23) < 0) || ((int)uVar19 < 0))
                goto LAB_00649284;
                uVar19 = *(uint *)(&pGVar3->field_0x0 + lVar23) ^ uVar19;
                if (uVar19 < 2) {
                  if (uVar19 != -((int)((uint)((ulong)*(undefined8 *)pGVar21 >> 0x20) ^
                                       (uint)((ulong)*(undefined8 *)((long)pGVar3 + lVar23 + -8) >>
                                             0x20)) >> 0x1f)) {
                    __assert_fail("(pObj->Value ^ pRepr->Value) == (pObj->fPhase ^ pRepr->fPhase)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                                  ,0x3d7,
                                  "int Cec2_ManPerformSweeping(Gia_Man_t *, Cec2_Par_t *, Gia_Man_t **)"
                                 );
                  }
                  p->pReprs[lVar11] = (Gia_Rpr_t)((uint)GVar2 | 0x10000000);
                }
                else {
                  iVar10 = Cec2_ManSweepNode(pMan,(int)lVar11);
                  if (iVar10 == 0) {
                    *(undefined4 *)(&pGVar3->field_0x0 + lVar23) = 0xffffffff;
                    pGVar13 = p->pObjs;
                    if ((pGVar21 < pGVar13) || (pGVar13 + p->nObjs <= pGVar21)) goto LAB_00649227;
                    iVar10 = p->iPatsPi;
                    if (iVar10 < 0) {
                      __assert_fail("Var >= 0 && !(c >> 1)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                    ,0x12e,"int Abc_Var2Lit(int, int)");
                    }
                    pVVar12 = pMan->vCexTriples;
                    uVar6 = *(undefined8 *)pGVar21;
                    uVar5 = *(undefined8 *)((long)pGVar3 + lVar23 + -8);
                    Vec_IntPush(pVVar12,(int)((ulong)((long)pGVar21 - (long)pGVar13) >> 2) *
                                        -0x55555555);
                    Vec_IntPush(pVVar12,(int)lVar11);
                    Vec_IntPush(pVVar12,iVar10 * 2 -
                                        ((int)((uint)((ulong)uVar6 >> 0x20) ^
                                              (uint)((ulong)uVar5 >> 0x20)) >> 0x1f));
                    bVar8 = true;
                  }
                  else if ((p->pReprs[lVar11].field_0x3 & 0x10) != 0) {
                    if ((int)pGVar21->Value < 0) goto LAB_00649265;
                    *(uint *)(&pGVar3->field_0x0 + lVar23) =
                         pGVar21->Value ^
                         ((uint)((ulong)*(undefined8 *)pGVar21 >> 0x20) ^
                         (uint)((ulong)*(undefined8 *)((long)pGVar3 + lVar23 + -8) >> 0x20)) >> 0x1f
                    ;
                  }
                }
              }
            }
          }
          lVar11 = lVar11 + 1;
          lVar23 = lVar23 + 0xc;
        } while (lVar11 < p->nObjs);
        bVar8 = !bVar8;
      }
      if (!bVar8) {
        uVar19 = Cec2_ManSimulate(p,pMan->vCexTriples,pMan);
        if ((uVar19 != 0) && (pPars->fVerbose != 0)) {
          printf("Failed to resimulate %d times with pattern = %d  (total = %d).\n",(ulong)uVar19,
                 (ulong)(uint)pMan->nPatterns,(ulong)(uint)(pPars->nSimWords << 6));
        }
        if ((pPars->fIsMiter != 0) && (iVar10 = Cec2_ManSimulateCos(p), iVar10 == 0)) break;
      }
      Cec2_ManPrintStats(p,pPars,pMan);
      iVar9 = iVar9 + 1;
    } while (!bVar8);
    if (ppNew != (Gia_Man_t **)0x0) {
      if (0 < p->nObjs) {
        lVar11 = 8;
        lVar23 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar4 = *(ulong *)((long)pGVar3 + lVar11 + -8);
          if (((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) &&
             (*(int *)(&pGVar3->field_0x0 + lVar11) == -1)) {
            uVar19 = *(uint *)((long)pGVar3 +
                              lVar11 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3);
            if (((int)uVar19 < 0) ||
               (uVar22 = *(uint *)((long)pGVar3 +
                                  lVar11 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar22 < 0)) goto LAB_00649265;
            iVar9 = Gia_ManHashAnd(pMan->pNew,uVar19 ^ (uint)(uVar4 >> 0x1d) & 1,
                                   uVar22 ^ (uint)(uVar4 >> 0x3d) & 1);
            *(int *)(&pGVar3->field_0x0 + lVar11) = iVar9;
          }
          lVar23 = lVar23 + 1;
          lVar11 = lVar11 + 0xc;
        } while (lVar23 < p->nObjs);
      }
      pVVar12 = p->vCos;
      if (0 < pVVar12->nSize) {
        lVar11 = 0;
        do {
          iVar9 = pVVar12->pArray[lVar11];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
LAB_00649246:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar9;
          uVar6 = *(undefined8 *)pGVar3;
          uVar19 = pGVar3[-(ulong)((uint)uVar6 & 0x1fffffff)].Value;
          if ((int)uVar19 < 0) {
LAB_00649265:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar14 = pMan->pNew;
          uVar22 = uVar19 >> 1;
          if (pGVar14->nObjs <= (int)uVar22) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(pGVar14->pObjs + uVar22) & 0x1fffffff) != 0 &&
              (int)*(uint *)(pGVar14->pObjs + uVar22) < 0) {
            __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
          }
          pGVar13 = Gia_ManAppendObj(pGVar14);
          uVar4 = *(ulong *)pGVar13;
          *(ulong *)pGVar13 = uVar4 | 0x80000000;
          pGVar21 = pGVar14->pObjs;
          if ((pGVar13 < pGVar21) || (pGVar21 + pGVar14->nObjs <= pGVar13)) {
LAB_00649227:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar18 = (ulong)(((uint)((int)pGVar13 - (int)pGVar21) >> 2) * -0x55555555 - uVar22 &
                          0x1fffffff);
          uVar20 = (ulong)((uVar19 << 0x1d ^ (uint)uVar6) & 0x20000000);
          *(ulong *)pGVar13 = uVar20 | uVar4 & 0xffffffffc0000000 | 0x80000000 | uVar18;
          *(ulong *)pGVar13 =
               uVar20 | uVar4 & 0xe0000000c0000000 | 0x80000000 | uVar18 |
               (ulong)(pGVar14->vCos->nSize & 0x1fffffff) << 0x20;
          pGVar21 = pGVar14->pObjs;
          if ((pGVar13 < pGVar21) || (pGVar21 + pGVar14->nObjs <= pGVar13)) goto LAB_00649227;
          Vec_IntPush(pGVar14->vCos,(int)((ulong)((long)pGVar13 - (long)pGVar21) >> 2) * -0x55555555
                     );
          if (pGVar14->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(pGVar14,pGVar13 + -(ulong)((uint)*(undefined8 *)pGVar13 & 0x1fffffff),
                             pGVar13);
          }
          pGVar21 = pGVar14->pObjs;
          if ((pGVar13 < pGVar21) || (pGVar21 + pGVar14->nObjs <= pGVar13)) goto LAB_00649227;
          pGVar3->Value = (int)((ulong)((long)pGVar13 - (long)pGVar21) >> 2) * 0x55555556;
          lVar11 = lVar11 + 1;
          pVVar12 = p->vCos;
        } while (lVar11 < pVVar12->nSize);
      }
      pGVar14 = Gia_ManCleanup(pMan->pNew);
      *ppNew = pGVar14;
      pcVar7 = p->pName;
      if (pcVar7 == (char *)0x0) {
        pcVar16 = (char *)0x0;
      }
      else {
        sVar15 = strlen(pcVar7);
        pcVar16 = (char *)malloc(sVar15 + 1);
        strcpy(pcVar16,pcVar7);
      }
      pGVar14->pName = pcVar16;
      pcVar7 = p->pSpec;
      if (pcVar7 == (char *)0x0) {
        pcVar16 = (char *)0x0;
      }
      else {
        sVar15 = strlen(pcVar7);
        pcVar16 = (char *)malloc(sVar15 + 1);
        strcpy(pcVar16,pcVar7);
      }
      (*ppNew)->pSpec = pcVar16;
    }
  }
LAB_00649203:
  Cec2_ManDestroy(pMan);
  return (int)(p->pCexSeq == (Abc_Cex_t *)0x0);
}

Assistant:

int Cec2_ManPerformSweeping( Gia_Man_t * p, Cec2_Par_t * pPars, Gia_Man_t ** ppNew )
{
    Cec2_Man_t * pMan = Cec2_ManCreate( p, pPars ); 
    Gia_Obj_t * pObj, * pRepr, * pObjNew; 
    int i, Iter, fDisproved = 1;

    // check if any output trivially fails under all-0 pattern
    Gia_ManRandomW( 1 );
    Gia_ManSetPhase( p );
    if ( pPars->fIsMiter ) 
    {
        Gia_ManForEachCo( p, pObj, i )
            if ( pObj->fPhase )
            {
                p->pCexSeq = Cec2_ManDeriveCex( p, i, -1 );
                goto finalize;
            }
    }

    // simulate one round and create classes
    Cec2_ManSimAlloc( p, pPars->nSimWords );
    Cec2_ManSimulateCis( p );
    Cec2_ManSimulate( p, NULL, pMan );
    if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
        goto finalize;
    Cec2_ManCreateClasses( p, pMan );
    Cec2_ManPrintStats( p, pPars, pMan );

    // perform additinal simulation
    for ( i = 0; i < pPars->nSimRounds; i++ )
    {
        Cec2_ManSimulateCis( p );
        Cec2_ManSimulate( p, NULL, pMan );
        if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
            goto finalize;
        Cec2_ManPrintStats( p, pPars, pMan );
    }
    // perform sweeping
    //pMan = Cec2_ManCreate( p, pPars );
    for ( Iter = 0; fDisproved && Iter < pPars->nItersMax; Iter++ )
    {
        fDisproved = 0;
        pMan->nPatterns = 0;
        Cec2_ManSimulateCis( p );
        Vec_IntClear( pMan->vCexTriples );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( ~pObj->Value || Gia_ObjFailed(p, i) ) // skip swept nodes and failed nodes
                continue;
            if ( !~Gia_ObjFanin0(pObj)->Value || !~Gia_ObjFanin1(pObj)->Value ) // skip fanouts of non-swept nodes
                continue;
            assert( !Gia_ObjProved(p, i) && !Gia_ObjFailed(p, i) );
            // duplicate the node
            pObj->Value = Gia_ManHashAnd( pMan->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Vec_IntSize(&pMan->pNew->vCopies2) == Abc_Lit2Var(pObj->Value) )
            {
                pObjNew = Gia_ManObj( pMan->pNew, Abc_Lit2Var(pObj->Value) );
                pObjNew->fMark0 = Gia_ObjIsMuxType( pObjNew );
                Gia_ObjSetPhase( pMan->pNew, pObjNew );
                Vec_IntPush( &pMan->pNew->vCopies2, -1 );
            }
            assert( Vec_IntSize(&pMan->pNew->vCopies2) == Gia_ManObjNum(pMan->pNew) );
            pRepr = Gia_ObjReprObj( p, i );
            if ( pRepr == NULL || !~pRepr->Value )
                continue;
            if ( Abc_Lit2Var(pObj->Value) == Abc_Lit2Var(pRepr->Value) )
            {
                assert( (pObj->Value ^ pRepr->Value) == (pObj->fPhase ^ pRepr->fPhase) );
                Gia_ObjSetProved( p, i );
                continue;
            }
            if ( Cec2_ManSweepNode(pMan, i) )
            {
                if ( Gia_ObjProved(p, i) )
                    pObj->Value = Abc_LitNotCond( pRepr->Value, pObj->fPhase ^ pRepr->fPhase );
                continue;
            }
            pObj->Value = ~0;
            Vec_IntPushThree( pMan->vCexTriples, Gia_ObjId(p, pRepr), i, Abc_Var2Lit(p->iPatsPi, pObj->fPhase ^ pRepr->fPhase) );
            fDisproved = 1;
        }
        if ( fDisproved )
        {
            int Fails = Cec2_ManSimulate( p, pMan->vCexTriples, pMan );
            if ( Fails && pPars->fVerbose )
                printf( "Failed to resimulate %d times with pattern = %d  (total = %d).\n", Fails, pMan->nPatterns, pPars->nSimWords * 64 );
            if ( pPars->fIsMiter && !Cec2_ManSimulateCos(p) ) // cex detected
                break;
        }
        Cec2_ManPrintStats( p, pPars, pMan );
    }
    // finish the AIG, if it is not finished
    if ( ppNew )
    {
        Gia_ManForEachAnd( p, pObj, i )
            if ( !~pObj->Value ) 
                pObj->Value = Gia_ManHashAnd( pMan->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pMan->pNew, Gia_ObjFanin0Copy(pObj) );
        *ppNew = Gia_ManCleanup( pMan->pNew );
        (*ppNew)->pName = Abc_UtilStrsav( p->pName );
        (*ppNew)->pSpec = Abc_UtilStrsav( p->pSpec );
    }
finalize:
    Cec2_ManDestroy( pMan );
    //Gia_ManEquivPrintClasses( p, 1, 0 );
    return p->pCexSeq ? 0 : 1;
}